

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O3

size_t Assimp::FBX::Util::DecodeBase64(char *in,size_t inLength,uint8_t *out,size_t maxOutLength)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  
  if (1 < inLength && maxOutLength != 0) {
    cVar1 = in[inLength - 1];
    cVar2 = in[inLength - 2];
    if (inLength - (cVar1 == '=') != (ulong)(cVar2 == '=')) {
      lVar5 = 0;
      uVar6 = 0;
      sVar3 = 0;
      iVar7 = -8;
      do {
        if (((long)in[lVar5] < 0) || ((byte)base64DecodeTable[in[lVar5]] == 0xff)) {
          return 0;
        }
        uVar6 = uVar6 * 0x40 + (uint)(byte)base64DecodeTable[in[lVar5]];
        iVar4 = iVar7 + 6;
        if (-7 < iVar7) {
          out[sVar3] = (uint8_t)((int)uVar6 >> ((byte)iVar4 & 0x1f));
          sVar3 = sVar3 + 1;
          iVar4 = iVar7 + -2;
          uVar6 = uVar6 & 0xfff;
        }
        lVar5 = lVar5 + 1;
        iVar7 = iVar4;
      } while ((inLength - (cVar2 == '=')) - (ulong)(cVar1 == '=') != lVar5);
      return sVar3;
    }
  }
  return 0;
}

Assistant:

size_t DecodeBase64(const char* in, size_t inLength, uint8_t* out, size_t maxOutLength)
{
    if (maxOutLength == 0 || inLength < 2) {
        return 0;
    }
    const size_t realLength = inLength - size_t(in[inLength - 1] == '=') - size_t(in[inLength - 2] == '=');
    size_t dst_offset = 0;
    int val = 0, valb = -8;
    for (size_t src_offset = 0; src_offset < realLength; ++src_offset)
    {
        const uint8_t table_value = Util::DecodeBase64(in[src_offset]);
        if (table_value == 255)
        {
            return 0;
        }
        val = (val << 6) + table_value;
        valb += 6;
        if (valb >= 0)
        {
            out[dst_offset++] = static_cast<uint8_t>((val >> valb) & 0xFF);
            valb -= 8;
            val &= 0xFFF;
        }
    }
    return dst_offset;
}